

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O2

void __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
          (match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               end,uint param_4)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  int max;
  int sub;
  
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          pcVar3 = cur->_M_current;
          if (pcVar3 == end._M_current) {
            return;
          }
          cVar2 = *pcVar3;
          if (cVar2 != '$') break;
          cur->_M_current = pcVar3 + 1;
          format_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                    (this,cur,end._M_current);
        }
        if (cVar2 != '(') break;
        cur->_M_current = pcVar3 + 1;
        format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                  (this,cur,end._M_current,0);
        detail::ensure_(cur->_M_current[-1] == ')',error_paren,
                        "unbalanced parentheses in format string",
                        "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::noop_output_iterator<char>]"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                        ,0x43b);
      }
      if (cVar2 != ':') break;
      if ((param_4 & 1) != 0) {
LAB_00135247:
        cur->_M_current = pcVar3 + 1;
        return;
      }
LAB_001351a2:
      cur->_M_current = pcVar3 + 1;
    }
    if (cVar2 == '\\') {
      pcVar1 = pcVar3 + 1;
      cur->_M_current = pcVar1;
      if ((pcVar1 == end._M_current) || (*pcVar1 != 'g')) {
        format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                  (this,cur,end._M_current);
      }
      else {
        cur->_M_current = pcVar3 + 2;
        format_named_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                  (this,cur,end._M_current);
      }
    }
    else {
      if (cVar2 == ')') goto LAB_00135247;
      if (cVar2 != '?') goto LAB_001351a2;
      cur->_M_current = pcVar3 + 1;
      detail::ensure_(pcVar3 + 1 != end._M_current,error_subreg,
                      "malformed conditional in format string",
                      "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::noop_output_iterator<char>]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                      ,0x440);
      iVar4 = detail::
              toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                        (cur,end,*(traits<char> **)(this + 0x80),10,*(int *)(this + 8) + -1);
      detail::ensure_(iVar4 != 0,error_subreg,"invalid back-reference",
                      "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::noop_output_iterator<char>]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                      ,0x443);
      detail::
      sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(this + 8),(long)iVar4);
      format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                (this,cur,end._M_current,1);
      param_4 = 0;
      if (cur->_M_current[-1] != ':') {
        return;
      }
    }
  } while( true );
}

Assistant:

OutputIterator format_all_impl_(ForwardIterator &cur, ForwardIterator end, OutputIterator out, bool metacolon = false) const
    {
        int max = 0, sub = 0;
        detail::noop_output_iterator<char_type> noop;

        while(cur != end)
        {
            switch(*cur)
            {
            case BOOST_XPR_CHAR_(char_type, '$'):
                out = this->format_backref_(++cur, end, out);
                break;

            case BOOST_XPR_CHAR_(char_type, '\\'):
                if(++cur != end && BOOST_XPR_CHAR_(char_type, 'g') == *cur)
                {
                    out = this->format_named_backref_(++cur, end, out);
                }
                else
                {
                    out = this->format_escape_(cur, end, out);
                }
                break;

            case BOOST_XPR_CHAR_(char_type, '('):
                out = this->format_all_impl_(++cur, end, out);
                BOOST_XPR_ENSURE_(BOOST_XPR_CHAR_(char_type, ')') == *(cur-1)
                  , regex_constants::error_paren, "unbalanced parentheses in format string");
                break;

            case BOOST_XPR_CHAR_(char_type, '?'):
                BOOST_XPR_ENSURE_(++cur != end
                  , regex_constants::error_subreg, "malformed conditional in format string");
                max = static_cast<int>(this->size() - 1);
                sub = detail::toi(cur, end, *this->traits_, 10, max);
                BOOST_XPR_ENSURE_(0 != sub, regex_constants::error_subreg, "invalid back-reference");
                if(this->sub_matches_[ sub ].matched)
                {
                    out = this->format_all_impl_(cur, end, out, true);
                    if(BOOST_XPR_CHAR_(char_type, ':') == *(cur-1))
                        this->format_all_impl_(cur, end, noop);
                }
                else
                {
                    this->format_all_impl_(cur, end, noop, true);
                    if(BOOST_XPR_CHAR_(char_type, ':') == *(cur-1))
                        out = this->format_all_impl_(cur, end, out);
                }
                return out;

            case BOOST_XPR_CHAR_(char_type, ':'):
                if(metacolon)
                {
                    BOOST_FALLTHROUGH;
            case BOOST_XPR_CHAR_(char_type, ')'):
                    ++cur;
                    return out;
                }
                BOOST_FALLTHROUGH;

            default:
                *out++ = *cur++;
                break;
            }
        }

        return out;
    }